

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notify_next.c
# Opt level: O3

mpt_input * mpt_notify_next(mpt_notify *no)

{
  mpt_buffer *pmVar1;
  _mpt_vptr_buffer *p_Var2;
  ulong uVar3;
  
  pmVar1 = (no->_wait)._buf;
  if ((pmVar1 != (mpt_buffer *)0x0) && (7 < pmVar1->_used)) {
    uVar3 = 0;
    do {
      p_Var2 = (&pmVar1[1]._vptr)[uVar3];
      if (p_Var2 != (_mpt_vptr_buffer *)0x0) {
        (&pmVar1[1]._vptr)[uVar3] = (_mpt_vptr_buffer *)0x0;
        return (mpt_input *)p_Var2;
      }
      uVar3 = uVar3 + 1;
    } while (pmVar1->_used >> 3 != uVar3);
    pmVar1->_used = 0;
  }
  return (mpt_input *)0x0;
}

Assistant:

extern MPT_INTERFACE(input) *mpt_notify_next(const MPT_STRUCT(notify) *no)
{
	MPT_STRUCT(buffer) *s;
	size_t len;
	
	if ((s = no->_wait._buf) && (len = s->_used / sizeof(void *))) {
		void **first = (void *) (s+1);
		size_t i;
		
		for (i = 0; i < len; i++) {
			MPT_INTERFACE(input) *curr;
			if (!(curr = first[i])) continue;
			first[i] = 0;
			return curr;
		}
		s->_used = 0;
	}
	return 0;
}